

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_ntop.c
# Opt level: O0

int sock_pton(char *cp,sockaddr *sa)

{
  sockaddr *__src;
  FILE *__stream;
  int __ecode;
  ushort **ppuVar1;
  char *pcVar2;
  size_t __n;
  bool bVar3;
  addrinfo *paStack_78;
  int rv;
  addrinfo *p;
  addrinfo *servinfo;
  addrinfo hints;
  char *port;
  char *host_name;
  char *ip_end;
  sockaddr *sa_local;
  char *cp_local;
  
  port = (char *)0x0;
  hints.ai_next = (addrinfo *)0x0;
  if ((cp == (char *)0x0) || (sa_local = (sockaddr *)cp, sa == (sockaddr *)0x0)) {
    cp_local._4_4_ = -1;
  }
  else {
    while( true ) {
      bVar3 = false;
      if (sa_local != (sockaddr *)0x0) {
        ppuVar1 = __ctype_b_loc();
        bVar3 = ((*ppuVar1)[(int)(char)sa_local->sa_family] & 0x2000) != 0;
      }
      if (!bVar3) break;
      sa_local = (sockaddr *)((long)&sa_local->sa_family + 1);
    }
    host_name = (char *)sa_local;
    if ((char)sa_local->sa_family == '[') {
      sa_local = (sockaddr *)((long)&sa_local->sa_family + 1);
      while( true ) {
        bVar3 = false;
        if (*host_name != '\0') {
          bVar3 = *host_name != ']';
        }
        if (!bVar3) break;
        host_name = host_name + 1;
      }
      if (*host_name == '\0') {
        return -2;
      }
      port = pcp_strndup((char *)sa_local,(long)host_name - (long)sa_local);
      host_name = host_name + 1;
    }
    for (; *host_name != '\0'; host_name = host_name + 1) {
      if (*host_name == ':') {
        if (hints.ai_next == (addrinfo *)0x0) {
          hints.ai_next = (addrinfo *)(host_name + 1);
        }
        else if (port == (char *)0x0) {
          hints.ai_next = (addrinfo *)0x0;
          port = strdup((char *)sa_local);
          break;
        }
      }
    }
    if (port == (char *)0x0) {
      if ((*host_name == '\0') && (hints.ai_next != (addrinfo *)0x0)) {
        if (1 < (long)hints.ai_next - (long)sa_local) {
          port = pcp_strndup((char *)sa_local,(long)hints.ai_next + (-1 - (long)sa_local));
        }
      }
      else {
        port = pcp_strndup((char *)sa_local,(long)host_name - (long)sa_local);
      }
    }
    memset(&servinfo,0,0x30);
    servinfo._4_4_ = 0;
    hints.ai_flags = 2;
    servinfo._0_4_ = 8;
    __ecode = getaddrinfo(port,(char *)hints.ai_next,(addrinfo *)&servinfo,(addrinfo **)&p);
    __stream = _stderr;
    if (__ecode == 0) {
      for (paStack_78 = p; paStack_78 != (addrinfo *)0x0; paStack_78 = paStack_78->ai_next) {
        if ((paStack_78->ai_family == 2) || (paStack_78->ai_family == 10)) {
          __src = paStack_78->ai_addr;
          __n = get_sa_len(paStack_78->ai_addr);
          memcpy(sa,__src,__n);
          if (port == (char *)0x0) {
            if (paStack_78->ai_family == 2) {
              sa->sa_data[2] = '\0';
              sa->sa_data[3] = '\0';
              sa->sa_data[4] = '\0';
              sa->sa_data[5] = '\0';
            }
            else {
              if (paStack_78->ai_family != 10) {
                return -2;
              }
              memset(sa->sa_data + 6,0,0x1c);
            }
          }
          break;
        }
      }
      freeaddrinfo((addrinfo *)p);
      if (port != (char *)0x0) {
        free(port);
      }
      cp_local._4_4_ = 0;
    }
    else {
      pcVar2 = gai_strerror(__ecode);
      fprintf(__stream,"getaddrinfo: %s\n",pcVar2);
      if (port != (char *)0x0) {
        free(port);
      }
      cp_local._4_4_ = -2;
    }
  }
  return cp_local._4_4_;
}

Assistant:

int sock_pton(const char *cp, struct sockaddr *sa) {
    const char *ip_end;
    char *host_name = NULL;
    const char *port = NULL;
    if ((!cp) || (!sa)) {
        return -1;
    }

    // skip ws
    while ((cp) && (isspace(*cp))) {
        ++cp;
    }

    ip_end = cp;
    if (*cp == '[') { // find matching bracket ']'
        ++cp;
        while ((*ip_end) && (*ip_end != ']')) {
            ++ip_end;
        }

        if (!*ip_end) {
            return -2;
        }
        host_name = strndup(cp, ip_end - cp);
        ++ip_end;
    }
    { // find start of port part
        while (*ip_end) {
            if (*ip_end == ':') {
                if (!port) {
                    port = ip_end + 1;
                } else if (host_name == NULL) { // means addr has [] block
                    port = NULL; // more than 1 ":" => assume the whole addr is
                                 // IPv6 address w/o port
                    host_name = strdup(cp);
                    break;
                }
            }
            ++ip_end;
        }
        if (!host_name) {
            if ((*ip_end == 0) && (port != NULL)) {
                if (port - cp > 1) { // only port entered
                    host_name = strndup(cp, port - cp - 1);
                }
            } else {
                host_name = strndup(cp, ip_end - cp);
            }
        }
    }

    // getaddrinfo for host
    {
        struct addrinfo hints, *servinfo, *p;
        int rv;

        memset(&hints, 0, sizeof hints);
        hints.ai_family = AF_UNSPEC;
        hints.ai_socktype = SOCK_DGRAM;
        hints.ai_flags = AI_V4MAPPED;

        if ((rv = getaddrinfo(host_name, port, &hints, &servinfo)) != 0) {
            fprintf(stderr, "getaddrinfo: %s\n", gai_strerror(rv));
            if (host_name)
                free(host_name);
            return -2;
        }

        for (p = servinfo; p != NULL; p = p->ai_next) {
            if ((p->ai_family == AF_INET) || (p->ai_family == AF_INET6)) {
                memcpy(sa, p->ai_addr, SA_LEN(p->ai_addr));
                if (host_name == NULL) { // getaddrinfo returns localhost ip if
                                         // hostname is null
                    switch (p->ai_family) {
                    case AF_INET:
                        ((struct sockaddr_in *)sa)->sin_addr.s_addr =
                            INADDR_ANY;
                        break;
                    case AF_INET6:
                        memset(&((struct sockaddr_in6 *)sa)->sin6_addr, 0,
                               sizeof(struct sockaddr_in6));
                        break;
                    default: // Should never happen LCOV_EXCL_START
                        if (host_name)
                            free(host_name);
                        return -2;
                    } // LCOV_EXCL_STOP
                }
                break;
            }
        }
        freeaddrinfo(servinfo);
    }

    if (host_name)
        free(host_name);
    return 0;
}